

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O1

int __thiscall r_memory_map::_get_posix_access_flags(r_memory_map *this,int flags)

{
  return (uint)flags >> 2 & 1 | flags & 0x10U | (flags & 2U) << 4 | (uint)flags >> 2 & 2;
}

Assistant:

int r_memory_map::_get_posix_access_flags(int flags) const
{
    int osFlags = 0;

    if(flags & MM_TYPE_FILE)
        osFlags |= MAP_FILE;
    if(flags & MM_TYPE_ANON)
    {
        osFlags |= MAP_ANONYMOUS;
    }
    if(flags & MM_SHARED)
        osFlags |= MAP_SHARED;
    if(flags & MM_PRIVATE)
        osFlags |= MAP_PRIVATE;
    if(flags & MM_FIXED)
        osFlags |= MAP_FIXED;

    return osFlags;
}